

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O2

Data * Data::equal(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Data *pDVar1;
  Data *pDVar2;
  pointer ppDVar3;
  long lVar4;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  iterator __begin1;
  pointer ppDVar5;
  Data **ppDVar6;
  bool bVar7;
  
  ppDVar5 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar1 = *ppDVar5;
  pDVar2 = ppDVar5[1];
  if (pDVar1 == (Data *)0x0) {
LAB_00104865:
    bVar7 = pDVar1->field_0xc == pDVar2->field_0xc;
  }
  else {
    lVar4 = __dynamic_cast(pDVar1,&typeinfo,&Integer::typeinfo,0);
    if (lVar4 == 0) goto LAB_00104865;
    ppDVar6 = &falseData;
    if (pDVar2 == (Data *)0x0) goto LAB_0010487f;
    lVar4 = __dynamic_cast(pDVar2,&typeinfo,&Integer::typeinfo,0);
    if (lVar4 == 0) goto LAB_0010487f;
    bVar7 = pDVar1[1]._vptr_Data == pDVar2[1]._vptr_Data;
  }
  ppDVar6 = &falseData;
  if (bVar7) {
    ppDVar6 = &trueData;
  }
LAB_0010487f:
  pDVar1 = *ppDVar6;
  ppDVar3 = (dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (; ppDVar5 != ppDVar3; ppDVar5 = ppDVar5 + 1) {
    check(*ppDVar5);
  }
  std::_Vector_base<Data_*,_std::allocator<Data_*>_>::~_Vector_base
            (&dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>);
  operator_delete(dataPara);
  return pDVar1;
}

Assistant:

Data *Data::equal(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    Data *a = (*dataPara)[0];
    Data *b = (*dataPara)[1];
    if (dynamic_cast<Integer *>(a) != NULL) {
        if (dynamic_cast<Integer *>(b) != NULL) {
            if (((Integer *) a)->value == ((Integer *) b)->value) {
                result = Data::trueData;
            } else {
                result = Data::falseData;
            }
        } else {
            result = Data::falseData;
        }
    } else {
        if (((Bool *) a)->value == ((Bool *) b)->value) {
            result = Data::trueData;
        } else {
            result = Data::falseData;
        }
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}